

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool cpp_properties::
     parse<std::forward_list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>,cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>>,cpp_properties::properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>>>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,
               forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *cpp_properties)

{
  bool bVar1;
  undefined1 local_3d8 [8];
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  lexer;
  properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>
  actor;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>_>
  action;
  
  actor._88_8_ = first._M_current;
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  ::cpp_properties_lexer
            ((cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
              *)local_3d8);
  first_local._M_current =
       (char *)((long)&lexer.
                       super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                       .self.targetstate.field_2 + 8);
  actor.properties._0_1_ = 0;
  actor.property.super_type.m_storage.dummy_._56_8_ =
       properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>
       ::allocate;
  actor.current_reference = 0;
  lexer.
  super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  .self.targetstate.field_2._8_8_ = cpp_properties;
  bVar1 = boost::spirit::lex::
          tokenize<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cpp_properties::cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,mpl_::bool_<false>,mpl_::bool_<true>>>>,cpp_properties::parse<std::forward_list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cpp_properties::properties_actor_traits<std::forward_list<std::___nst*,std::__cxx11::string>,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>const&)_1_>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&actor.field_0x58,last,
                     (cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                      *)local_3d8,
                     (properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>_>
                      *)&first_local,(char_type *)0x0);
  properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>
  ::~properties_actor((properties_actor<cpp_properties::properties_actor_traits<std::forward_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_front_adapter_policy>_>
                       *)((long)&lexer.
                                 super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                                 .self.targetstate.field_2 + 8));
  if ((size_type *)
      lexer.
      super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
      .self.state.field_2._8_8_ !=
      &lexer.
       super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
       .self.targetstate._M_string_length) {
    operator_delete((void *)lexer.
                            super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                            .self.state.field_2._8_8_,
                    lexer.
                    super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                    .self.targetstate._M_string_length + 1);
  }
  if (lexer.
      super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
      .self.def !=
      (lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
       *)&lexer.
          super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
          .self.state._M_string_length) {
    operator_delete(lexer.
                    super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                    .self.def,
                    lexer.
                    super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                    .self.state._M_string_length + 1);
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
  ::~lexer((lexer<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>
            *)local_3d8);
  return bVar1;
}

Assistant:

bool parse(Iterator first, Iterator last, T &cpp_properties) {
  // create the token definition instance needed to invoke the lexical analyzer
  using lexer_type = lex::lexertl::lexer<lex::lexertl::token<Iterator>>;
  cpp_properties_lexer<lexer_type> lexer;

  Actor actor(cpp_properties);
  Action action = std::move(make_action(actor));

  return lex::tokenize(
      first, last, lexer,
      [&action](const typename cpp_properties_lexer<lexer_type>::token_type &token) { return action(token); });
}